

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorMocUic.cxx
# Opt level: O0

bool __thiscall
cmQtAutoGeneratorMocUic::JobParseT::ParseMocHeader(JobParseT *this,WorkerT *wrk,MetaT *meta)

{
  MocSettingsT *this_00;
  ulong uVar1;
  JobMocT *this_01;
  cmQtAutoGeneratorMocUic *this_02;
  string local_c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  JobHandleT local_50;
  JobHandleT jobHandle;
  string macroName;
  bool success;
  MetaT *meta_local;
  WorkerT *wrk_local;
  JobParseT *this_local;
  
  macroName.field_2._M_local_buf[0xf] = '\x01';
  this_00 = WorkerT::Moc(wrk);
  MocSettingsT::FindMacro((string *)&jobHandle,this_00,&meta->Content);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string((string *)&local_78,(string *)&this->FileName);
    std::__cxx11::string::string((string *)&local_a8);
    std::__cxx11::string::string(local_c8);
    std::
    make_unique<cmQtAutoGeneratorMocUic::JobMocT,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
               &local_78,&local_a8);
    std::
    unique_ptr<cmQtAutoGeneratorMocUic::JobT,std::default_delete<cmQtAutoGeneratorMocUic::JobT>>::
    unique_ptr<cmQtAutoGeneratorMocUic::JobMocT,std::default_delete<cmQtAutoGeneratorMocUic::JobMocT>,void>
              ((unique_ptr<cmQtAutoGeneratorMocUic::JobT,std::default_delete<cmQtAutoGeneratorMocUic::JobT>>
                *)&local_50,
               (unique_ptr<cmQtAutoGeneratorMocUic::JobMocT,_std::default_delete<cmQtAutoGeneratorMocUic::JobMocT>_>
                *)local_58);
    std::
    unique_ptr<cmQtAutoGeneratorMocUic::JobMocT,_std::default_delete<cmQtAutoGeneratorMocUic::JobMocT>_>
    ::~unique_ptr((unique_ptr<cmQtAutoGeneratorMocUic::JobMocT,_std::default_delete<cmQtAutoGeneratorMocUic::JobMocT>_>
                   *)local_58);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_78);
    this_01 = (JobMocT *)
              std::
              unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>
              ::operator*((unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>
                           *)&local_50);
    JobMocT::FindDependencies(this_01,wrk,&meta->Content);
    this_02 = WorkerT::Gen(wrk);
    macroName.field_2._M_local_buf[0xf] = ParallelJobPushMoc(this_02,&local_50);
    std::
    unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>::
    ~unique_ptr(&local_50);
  }
  std::__cxx11::string::~string((string *)&jobHandle);
  return (bool)macroName.field_2._M_local_buf[0xf];
}

Assistant:

bool cmQtAutoGeneratorMocUic::JobParseT::ParseMocHeader(WorkerT& wrk,
                                                        MetaT const& meta)
{
  bool success = true;
  std::string const macroName = wrk.Moc().FindMacro(meta.Content);
  if (!macroName.empty()) {
    JobHandleT jobHandle = cm::make_unique<JobMocT>(
      std::string(FileName), std::string(), std::string());
    // Read dependencies from this source
    static_cast<JobMocT&>(*jobHandle).FindDependencies(wrk, meta.Content);
    success = wrk.Gen().ParallelJobPushMoc(jobHandle);
  }
  return success;
}